

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeLocals.cpp
# Opt level: O0

void __thiscall wasm::MergeLocals::doWalkFunction(MergeLocals *this,Function *func)

{
  Function *func_local;
  MergeLocals *this_local;
  
  Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>::
  doWalkFunction(&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                  .
                  super_Walker<wasm::MergeLocals,_wasm::UnifiedExpressionVisitor<wasm::MergeLocals,_void>_>
                 ,func);
  optimizeCopies(this);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // first, instrument the graph by modifying each copy
    //   (local.set $x
    //    (local.get $y)
    //   )
    // to
    //   (local.set $x
    //    (local.tee $y
    //     (local.get $y)
    //    )
    //   )
    // That is, we add a trivial assign of $y. This ensures we
    // have a new assignment of $y at the location of the copy,
    // which makes it easy for us to see if the value if $y
    // is still used after that point
    Super::doWalkFunction(func);

    // optimize the copies, merging when we can, and removing
    // the trivial assigns we added temporarily
    optimizeCopies();
  }